

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O0

Vector3d * __thiscall OpenMD::StuntDouble::body2Lab(StuntDouble *this,Vector3d *v,int frame)

{
  Vector3d *in_RDI;
  Vector<double,_3U> *in_stack_ffffffffffffff08;
  Vector3d *this_00;
  StuntDouble *in_stack_ffffffffffffff28;
  Vector<double,_3U> *in_stack_ffffffffffffff30;
  RectMatrix<double,_3U,_3U> *in_stack_ffffffffffffff38;
  
  this_00 = in_RDI;
  getA(in_stack_ffffffffffffff28,(int)((ulong)&stack0xffffffffffffff38 >> 0x20));
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_ffffffffffffff38);
  OpenMD::operator*(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Vector3<double>::Vector3(this_00,in_stack_ffffffffffffff08);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27596c);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x275976);
  return in_RDI;
}

Assistant:

Vector3d body2Lab(const Vector3d& v, int frame) {
      return getA(frame).transpose() * v;
    }